

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O0

int vocgtyp(voccxdef *ctx,char **cmd,int *types,char *orgbuf)

{
  long lVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  char *in_RCX;
  char *__dest;
  long in_RDX;
  undefined1 *__dest_00;
  long *in_RSI;
  long in_RDI;
  int cnt;
  char *p_1;
  size_t i_1;
  char buf [128];
  int rem;
  char qu;
  char *p2;
  char *strp;
  char *outp;
  char **w;
  int wc;
  int i;
  char *q;
  char redobuf [200];
  char *p1;
  char oopsbuf [128];
  int unknown_count;
  int len;
  char *p;
  int t;
  int cur;
  char *in_stack_fffffffffffffd80;
  undefined1 *in_stack_fffffffffffffd88;
  uint in_stack_fffffffffffffd90;
  uint uVar5;
  int in_stack_fffffffffffffd94;
  voccxdef *in_stack_fffffffffffffd98;
  char *in_stack_fffffffffffffda0;
  voccxdef *in_stack_fffffffffffffda8;
  int in_stack_fffffffffffffdc0;
  int in_stack_fffffffffffffdc4;
  char *in_stack_fffffffffffffdc8;
  voccxdef *in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  char **in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe30;
  undefined3 uVar6;
  undefined4 in_stack_fffffffffffffe34;
  voccxdef *in_stack_fffffffffffffe38;
  undefined1 *local_1b8;
  long *plVar7;
  int local_1a4;
  char *local_1a0;
  undefined1 local_198 [200];
  char *local_d0;
  char local_c8 [136];
  int local_40;
  int local_3c;
  char *local_38;
  uint local_30;
  int local_2c;
  char *local_28;
  long local_20;
  long *local_18;
  long local_10;
  
  local_40 = 0;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
LAB_00236d92:
  if ((*(byte *)(local_10 + 0x119a) & 4) != 0) {
    outformat(in_stack_fffffffffffffd80);
  }
  local_2c = 0;
  do {
    if (local_18[local_2c] == 0) {
      *(int *)(local_10 + 0x119c) = local_40;
      *(int *)(local_10 + 0x11a0) = local_40;
      return 0;
    }
    local_38 = (char *)local_18[local_2c];
    sVar3 = strlen(local_38);
    local_3c = (int)sVar3;
    local_30 = voc_lookup_type(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                               in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0);
    if ((local_30 == 0) &&
       (iVar2 = voc_check_special(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                                  (int)((ulong)in_stack_fffffffffffffd98 >> 0x20)), iVar2 == 0)) {
      local_30 = 0x80;
      if ((*(int *)(local_10 + 0x119c) != 0) &&
         (*(int *)(local_10 + 0x11a0) - *(int *)(local_10 + 0x119c) <= local_40)) break;
      local_40 = local_40 + 1;
    }
    if ((*(byte *)(local_10 + 0x119a) & 4) != 0) {
      outshow();
      sprintf(&stack0xfffffffffffffda8,"... %s (",local_18[local_2c]);
      in_stack_fffffffffffffd88 = &stack0xfffffffffffffda8;
      sVar3 = strlen(&stack0xfffffffffffffda8);
      pcVar4 = in_stack_fffffffffffffd88 + sVar3;
      in_stack_fffffffffffffd94 = 0;
      for (in_stack_fffffffffffffda0 = (char *)0x0; in_stack_fffffffffffffda0 < (char *)0x8;
          in_stack_fffffffffffffda0 = in_stack_fffffffffffffda0 + 1) {
        if ((local_30 & 1 << ((byte)in_stack_fffffffffffffda0 & 0x1f)) != 0) {
          __dest = pcVar4;
          if (in_stack_fffffffffffffd94 != 0) {
            __dest = pcVar4 + 1;
            *pcVar4 = ',';
          }
          strcpy(__dest,type_names[(long)in_stack_fffffffffffffda0]);
          sVar3 = strlen(__dest);
          pcVar4 = __dest + sVar3;
          in_stack_fffffffffffffd94 = in_stack_fffffffffffffd94 + 1;
        }
      }
      *pcVar4 = ')';
      pcVar4[1] = '\\';
      in_stack_fffffffffffffd98 = (voccxdef *)(pcVar4 + 3);
      pcVar4[2] = 'n';
      *(undefined1 *)&in_stack_fffffffffffffd98->voccxerr = 0;
      outformat(in_stack_fffffffffffffd80);
    }
    *(uint *)(local_20 + (long)local_2c * 4) = local_30;
    local_2c = local_2c + 1;
  } while( true );
  *(undefined4 *)(local_10 + 0x119c) = 0;
  local_d0 = voc_read_oops(in_stack_fffffffffffffd98,
                           (char *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                           (size_t)in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  if (local_d0 == (char *)0x0) {
    strcpy(local_28,local_c8);
    *(undefined4 *)(local_10 + 0x119c) = 0;
    *(undefined4 *)(local_10 + 0x568) = 1;
    return 1;
  }
  local_1a4 = 0;
  local_1b8 = local_198;
  for (plVar7 = local_18; *plVar7 != 0; plVar7 = plVar7 + 1) {
    if (local_1a4 == local_2c) {
      local_1a0 = local_d0;
      local_3c = 0;
      uVar5 = in_stack_fffffffffffffd90;
      while( true ) {
        in_stack_fffffffffffffd90 = uVar5 & 0xffffff;
        if ((((*local_1a0 != '\0') &&
             (in_stack_fffffffffffffd90 = uVar5 & 0xffffff, *local_1a0 != '.')) &&
            (in_stack_fffffffffffffd90 = uVar5 & 0xffffff, *local_1a0 != ',')) &&
           (in_stack_fffffffffffffd90 = uVar5 & 0xffffff, *local_1a0 != '?')) {
          in_stack_fffffffffffffd90 = CONCAT13(*local_1a0 != '!',(int3)uVar5);
        }
        if ((char)(in_stack_fffffffffffffd90 >> 0x18) == '\0') break;
        local_1a0 = local_1a0 + 1;
        local_3c = local_3c + 1;
        uVar5 = in_stack_fffffffffffffd90;
      }
      memcpy(local_1b8,local_d0,(long)local_3c);
      local_1b8 = local_1b8 + local_3c;
    }
    else if (*(char *)*plVar7 == '\"') {
      local_3c = osrp2((void *)(*plVar7 + 1));
      lVar1 = *plVar7;
      uVar6 = (undefined3)in_stack_fffffffffffffe34;
      in_stack_fffffffffffffe34 = CONCAT13(0x22,uVar6);
      local_3c = local_3c + -2;
      in_stack_fffffffffffffe38 = (voccxdef *)(lVar1 + 3);
      for (in_stack_fffffffffffffe30 = local_3c; in_stack_fffffffffffffe30 != 0;
          in_stack_fffffffffffffe30 = in_stack_fffffffffffffe30 + -1) {
        if (*(char *)&in_stack_fffffffffffffe38->voccxerr == '\"') {
          in_stack_fffffffffffffe34 = CONCAT13(0x27,uVar6);
          break;
        }
        in_stack_fffffffffffffe38 = (voccxdef *)((long)&in_stack_fffffffffffffe38->voccxerr + 1);
      }
      __dest_00 = local_1b8 + 1;
      *local_1b8 = (char)((uint)in_stack_fffffffffffffe34 >> 0x18);
      memcpy(__dest_00,(voccxdef *)(lVar1 + 3),(long)local_3c);
      local_1b8 = __dest_00 + local_3c + 1;
      __dest_00[local_3c] = (char)((uint)in_stack_fffffffffffffe34 >> 0x18);
    }
    else {
      sVar3 = strlen((char *)*plVar7);
      local_3c = (int)sVar3;
      memcpy(local_1b8,(void *)*plVar7,(long)local_3c);
      local_1b8 = local_1b8 + local_3c;
    }
    *local_1b8 = 0x20;
    local_1a4 = local_1a4 + 1;
    local_1b8 = local_1b8 + 1;
  }
  *local_1b8 = 0;
  *(undefined1 *)*local_18 = 0;
  iVar2 = voctok(in_stack_fffffffffffffe38,
                 (char *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                 in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,
                 in_stack_fffffffffffffe18,(int)plVar7);
  if (iVar2 < 1) {
    return 1;
  }
  local_18[iVar2] = 0;
  goto LAB_00236d92;
}

Assistant:

int vocgtyp(voccxdef *ctx, char *cmd[], int types[], char *orgbuf)
{
    int      cur;
    int      t;
    char    *p;
    int      len;
    int      unknown_count = 0;
    
startover:
    if (ctx->voccxflg & VOCCXFDBG)
        tioputs(ctx->vocxtio, ". Checking words:\\n");

    for (cur = 0 ; cmd[cur] ; ++cur)
    {
        /* get the word */
        p = cmd[cur];
        len = strlen(p);

        /* look it up */
        t = voc_lookup_type(ctx, p, len, FALSE);
        
        /* see if the word was found */
        if (t == 0 && !voc_check_special(ctx, p, VOCW_OF))
        {
            /* 
             *   We didn't find the word.  For now, set its type to
             *   "unknown".
             */
            t = VOCT_UNKNOWN;

            /*
             *   If the unknown word count is already non-zero, it means
             *   that we've tried to let the game resolve this word using
             *   the parseUnknownDobj/Iobj mechanism, but it wasn't able
             *   to do so, thus we've come back here to use the normal
             *   "oops" processing instead.
             *   
             *   Don't generate a message until we get to the first
             *   unknown word from the original list that we weren't able
             *   to resolve.  We may have been able to handle one or more
             *   of the original list of unknown words (through
             *   parseNounPhrase or other means), so we don't want to
             *   generate a message for any words we ended up handling.
             *   The number we resolved is the last full unknown count
             *   minus the remaining unknown count.  
             */
            if (ctx->voccxunknown != 0
                && unknown_count >= ctx->voccxlastunk - ctx->voccxunknown)
            {
                char  oopsbuf[VOCBUFSIZ];
                char *p1;
                
                /* 
                 *   we can try using the parseUnknownDobj/Iobj again
                 *   after this, so clear the unknown word count for now
                 */
                ctx->voccxunknown = 0;

                /* display an error, and ask for a new command */
                p1 = voc_read_oops(ctx, oopsbuf, sizeof(oopsbuf), p);

                /* if they responded with replacement text, apply it */
                if (p1 != 0)
                {
                    char   redobuf[200];
                    char  *q;
                    int    i;
                    int    wc;
                    char **w;
                    char  *outp;
                    
                    /* 
                     *   copy words from the original string, replacing
                     *   the unknown word with what follows the "oops" in
                     *   the new command 
                     */
                    for (outp = redobuf, i = 0, w = cmd ; *w != 0 ; ++i, ++w)
                    {
                        
                        /* see what we have */
                        if (i == cur)
                        {
                            /* 
                             *   We've reached the word to be replaced.
                             *   Ignore the original token, and replace it
                             *   with the word or words from the OOPS
                             *   command 
                             */
                            for (q = p1, len = 0 ;
                                 *q != '\0' && *q != '.' && *q != ','
                                     && *q != '?' && *q != '!' ; ++q, ++len) ;
                            memcpy(outp, p1, (size_t)len);
                            outp += len;
                        }
                        else if (**w == '"')
                        {
                            char *strp;
                            char *p2;
                            char qu;
                            int rem;

                            /* 
                             *   It's a string - add a quote mark, then
                             *   copy the string as indicated by the
                             *   length prefix, then add another quote
                             *   mark.  Get the length by reading the
                             *   length prefix following the quote mark,
                             *   and get a pointer to the text of the
                             *   string, which immediately follows the
                             *   length prefix.  
                             */
                            len = osrp2(*w + 1) - 2;
                            strp = *w + 3;

                            /*
                             *   We need to figure out what kind of quote
                             *   mark to use.  If the string contains any
                             *   embedded double quotes, use single quotes
                             *   to delimit the string; otherwise, use
                             *   double quotes.  Presume we'll use double
                             *   quotes as the delimiter, then scan the
                             *   string for embedded double quotes.  
                             */
                            for (qu = '"', p2 = strp, rem = len ; rem != 0 ;
                                 --rem, ++p2)
                            {
                                /* 
                                 *   if this is an embedded double quote,
                                 *   use single quotes to delimite the
                                 *   string 
                                 */
                                if (*p2 == '"')
                                {
                                    /* use single quotes as delimiters */
                                    qu = '\'';

                                    /* no need to look any further */
                                    break;
                                }
                            }

                            /* add the open quote */
                            *outp++ = qu;

                            /* copy the string */
                            memcpy(outp, strp, len);
                            outp += len;

                            /* add the close quote */
                            *outp++ = qu;
                        }
                        else
                        {
                            /* 
                             *   it's an ordinary token - copy the
                             *   null-terminated string for the token from
                             *   the original command list 
                             */
                            len = strlen(*w);
                            memcpy(outp, *w, (size_t)len);
                            outp += len;
                        }

                        /* add a space between words */
                        *outp++ = ' ';
                    }
                    
                    /* terminate the new string */
                    *outp = '\0';
                    
                    /* try tokenizing the string */
                    *(cmd[0]) = '\0';
                    if ((wc = voctok(ctx, redobuf, cmd[0],
                                     cmd, FALSE, FALSE, TRUE)) <= 0)
                        return 1;
                    cmd[wc] = 0;

                    /* start over with the typing */
                    goto startover;
                }
                else
                {
                    /* 
                     *   They didn't start the command with "oops", so
                     *   this must be a brand new command.  Replace the
                     *   original command with the new command.  
                     */
                    strcpy(orgbuf, oopsbuf);

                    /* 
                     *   forget we had an unknown word so that we're sure
                     *   to start over with a new command 
                     */
                    ctx->voccxunknown = 0;
                    
                    /* 
                     *   set the "redo" flag to start over with the new
                     *   command 
                     */
                    ctx->voccxredo = 1;
                    
                    /* 
                     *   return an error to indicate the current command
                     *   has been aborted 
                     */
                    return 1;
                }
            }
            else
            {
                /*
                 *   We've now encountered an unknown word, and we're
                 *   going to defer resolution.  Remember this; we'll
                 *   count the unknown word in the context when we return
                 *   (do so only locally for now, since we may encounter
                 *   more unknown words before we return, in which case we
                 *   want to know that this is still the first pass).  
                 */
                ++unknown_count;
            }
        }

        /* display if in debug mode */
        if (ctx->voccxflg & VOCCXFDBG)
        {
            char    buf[128];
            size_t  i;
            char   *p;
            int     cnt;
            
            (void)tioshow(ctx->voccxtio);
            sprintf(buf, "... %s (", cmd[cur]);
            p = buf + strlen(buf);
            cnt = 0;
            for (i = 0 ; i < sizeof(type_names)/sizeof(type_names[0]) ; ++i)
            {
                if (t & (1 << i))
                {
                    if (cnt) *p++ = ',';
                    strcpy(p, type_names[i]);
                    p += strlen(p);
                    ++cnt;
                }
            }
            *p++ = ')';
            *p++ = '\\';
            *p++ = 'n';
            *p = '\0';
            tioputs(ctx->voccxtio, buf);
        }
        
        types[cur] = t;                         /* record type of this word */
    }

    /* if we found any unknown words, note this in our context */
    ctx->voccxunknown = unknown_count;
    ctx->voccxlastunk = unknown_count;
    
    /* successful acquisition of types */
    return 0;
}